

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int ARKodeGetCurrentMassMatrix(void *arkode_mem,SUNMatrix *M)

{
  undefined8 *in_RSI;
  long in_RDI;
  int retval;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x874,"ARKodeGetCurrentMassMatrix",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (*(int *)(in_RDI + 0x200) == 0) {
    *in_RSI = 0;
    local_4 = 0;
  }
  else {
    local_4 = arkLs_AccessMassMem(in_stack_ffffffffffffffd8,
                                  (char *)CONCAT44(in_stack_ffffffffffffffd4,
                                                   in_stack_ffffffffffffffd0),
                                  in_stack_ffffffffffffffc8);
    if (local_4 == 0) {
      *in_RSI = in_stack_ffffffffffffffd8->user_data;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeGetCurrentMassMatrix(void* arkode_mem, SUNMatrix* M)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return NULL for incompatible steppers */
  if (!ark_mem->step_supports_massmatrix)
  {
    *M = NULL;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set output and return */
  *M = arkls_mem->M;
  return (ARKLS_SUCCESS);
}